

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall amrex::Amr::initSubcycle(Amr *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  Print *in_RDI;
  string err_message;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int cycles;
  int cnt;
  int i;
  int nosub;
  ParmParse pp;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  undefined4 in_stack_fffffffffffffd20;
  undefined2 in_stack_fffffffffffffd24;
  undefined1 in_stack_fffffffffffffd26;
  undefined1 in_stack_fffffffffffffd27;
  undefined7 in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd58;
  string local_290 [8];
  int in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  Print *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  undefined4 in_stack_fffffffffffffd90;
  int iVar9;
  undefined4 in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  int iVar10;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  undefined4 in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  ParmParse *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffe20;
  ParmParse *in_stack_fffffffffffffe28;
  allocator local_b1;
  string local_b0 [128];
  undefined8 local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"amr",&local_b1);
  ParmParse::ParmParse
            ((ParmParse *)
             CONCAT17(in_stack_fffffffffffffd27,
                      CONCAT16(in_stack_fffffffffffffd26,
                               CONCAT24(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20))),
             (string *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  *(undefined4 *)&in_RDI[5].field_0x158 = 1;
  uVar1 = ParmParse::contains(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  if ((bool)uVar1) {
    if (*(int *)&in_RDI->os != 0) {
      OutStream();
      Print::Print(in_RDI,(ostream *)CONCAT17(uVar1,in_stack_fffffffffffffd38));
      Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                        (char (*) [47])CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08)
                       );
      Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                        (char (*) [55])CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08)
                       );
      Print::~Print(in_stack_fffffffffffffd80);
    }
    ParmParse::query((ParmParse *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                     (int *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                     in_stack_fffffffffffffd8c);
    if (in_stack_fffffffffffffdac < 1) {
      local_8 = "nosub <= 0 not allowed.\n";
      Error_host((char *)CONCAT17(in_stack_fffffffffffffd27,
                                  CONCAT16(in_stack_fffffffffffffd26,
                                           CONCAT24(in_stack_fffffffffffffd24,
                                                    in_stack_fffffffffffffd20))));
    }
    else {
      *(undefined4 *)&in_RDI[5].field_0x158 = 0;
    }
    std::__cxx11::string::operator=((string *)&in_RDI[1].field_0x28,"None");
  }
  else {
    std::__cxx11::string::operator=((string *)&in_RDI[1].field_0x28,"Auto");
    ParmParse::queryAdd((ParmParse *)
                        CONCAT17(in_stack_fffffffffffffd27,
                                 CONCAT16(in_stack_fffffffffffffd26,
                                          CONCAT24(in_stack_fffffffffffffd24,
                                                   in_stack_fffffffffffffd20))),
                        (char *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                        (string *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  }
  uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                          (char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  if ((bool)uVar1) {
    *(undefined4 *)&in_RDI[5].field_0x158 = 0;
    for (iVar9 = 0; iVar9 <= *(int *)((long)&in_RDI->os + 4); iVar9 = iVar9 + 1) {
      piVar6 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                          CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      *piVar6 = 1;
    }
  }
  else {
    uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                            (char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    if ((bool)uVar2) {
      iVar9 = ParmParse::countval(in_stack_fffffffffffffdb0,
                                  (char *)CONCAT44(in_stack_fffffffffffffdac,
                                                   in_stack_fffffffffffffda8),
                                  in_stack_fffffffffffffda4);
      if (iVar9 == 1) {
        iVar5 = 0;
        ParmParse::get((ParmParse *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                       (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                       &in_stack_fffffffffffffd80->rank,in_stack_fffffffffffffd7c);
        piVar6 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                            CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        *piVar6 = 1;
        for (iVar10 = 1; iVar10 <= *(int *)((long)&in_RDI->os + 4); iVar10 = iVar10 + 1) {
          iVar4 = iVar5;
          piVar6 = Vector<int,_std::allocator<int>_>::operator[]
                             ((Vector<int,_std::allocator<int>_> *)
                              CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          *piVar6 = iVar5;
          in_stack_fffffffffffffd1c = iVar5;
          iVar5 = iVar4;
        }
      }
      else if (iVar9 < 2) {
        local_18 = "Must provide a valid subcycling_iterations if mode is Manual";
        Error_host((char *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT24(in_stack_fffffffffffffd24,iVar9)))
                  );
      }
      else {
        ParmParse::getarr((ParmParse *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)
                          ,(char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                          (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd80,
                          in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78);
        piVar6 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                            CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        if (*piVar6 != 1) {
          local_10 = "First entry of subcycling_iterations must be 1";
          Error_host((char *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT24(in_stack_fffffffffffffd24,iVar9)
                                                    )));
        }
      }
      for (iVar5 = 1; iVar5 <= *(int *)((long)&in_RDI->os + 4); iVar5 = iVar5 + 1) {
        piVar6 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                            CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        iVar10 = *piVar6;
        iVar4 = AmrMesh::MaxRefRatio
                          ((AmrMesh *)
                           CONCAT17(uVar1,CONCAT16(uVar2,CONCAT24(in_stack_fffffffffffffd24,iVar9)))
                           ,in_stack_fffffffffffffd1c);
        if (iVar4 < iVar10) {
          local_20 = "subcycling iterations must always be <= ref_ratio";
          Error_host((char *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT24(in_stack_fffffffffffffd24,iVar9)
                                                    )));
        }
        piVar6 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                            CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        if (*piVar6 < 1) {
          local_28 = "subcycling iterations must always be > 0";
          Error_host((char *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT24(in_stack_fffffffffffffd24,iVar9)
                                                    )));
        }
      }
    }
    else {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                              (char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08))
      ;
      uVar8 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffd14);
      if (bVar3) {
        piVar6 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)
                            CONCAT44(uVar8,in_stack_fffffffffffffd10),
                            CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        *piVar6 = 1;
        for (iVar9 = 1; iVar9 <= *(int *)((long)&in_RDI->os + 4); iVar9 = iVar9 + 1) {
          iVar5 = AmrMesh::MaxRefRatio
                            ((AmrMesh *)
                             CONCAT17(uVar1,CONCAT16(uVar2,CONCAT24(in_stack_fffffffffffffd24,
                                                                    in_stack_fffffffffffffd20))),
                             in_stack_fffffffffffffd1c);
          piVar6 = Vector<int,_std::allocator<int>_>::operator[]
                             ((Vector<int,_std::allocator<int>_> *)CONCAT44(uVar8,iVar5),
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          *piVar6 = iVar5;
        }
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(uVar8,in_stack_fffffffffffffd10),
                                (char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08
                                                ));
        uVar7 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffd0c);
        if (bVar3) {
          piVar6 = Vector<int,_std::allocator<int>_>::operator[]
                             ((Vector<int,_std::allocator<int>_> *)
                              CONCAT44(uVar8,in_stack_fffffffffffffd10),
                              CONCAT44(uVar7,in_stack_fffffffffffffd08));
          *piVar6 = 1;
          for (iVar9 = 1; iVar9 <= *(int *)((long)&in_RDI->os + 4); iVar9 = iVar9 + 1) {
            iVar5 = AmrMesh::MaxRefRatio
                              ((AmrMesh *)
                               CONCAT17(uVar1,CONCAT16(uVar2,CONCAT24(in_stack_fffffffffffffd24,
                                                                      in_stack_fffffffffffffd20))),
                               in_stack_fffffffffffffd1c);
            piVar6 = Vector<int,_std::allocator<int>_>::operator[]
                               ((Vector<int,_std::allocator<int>_> *)
                                CONCAT44(uVar8,in_stack_fffffffffffffd10),CONCAT44(uVar7,iVar5));
            *piVar6 = iVar5;
          }
        }
        else {
          std::operator+(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                         (char *)CONCAT44(uVar8,in_stack_fffffffffffffd10));
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffd50);
          local_30 = std::__cxx11::string::c_str();
          Error_host((char *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT24(in_stack_fffffffffffffd24,
                                                                    in_stack_fffffffffffffd20))));
          std::__cxx11::string::~string(local_290);
        }
      }
    }
  }
  ParmParse::~ParmParse((ParmParse *)0x1380bd8);
  return;
}

Assistant:

void
Amr::initSubcycle ()
{
    BL_PROFILE("Amr::initSubcycle()");
    ParmParse pp("amr");
    sub_cycle = true;
    if (pp.contains("nosub"))
    {
        if (verbose) {
            amrex::Print() << "Warning: The nosub flag has been deprecated.\n "
                           << "... please use subcycling_mode to control subcycling.\n";
        }
        int nosub;
        pp.query("nosub",nosub);
        if (nosub > 0)
            sub_cycle = false;
        else
            amrex::Error("nosub <= 0 not allowed.\n");
        subcycling_mode = "None";
    }
    else
    {
        subcycling_mode = "Auto";
        pp.queryAdd("subcycling_mode",subcycling_mode);
    }

    if (subcycling_mode == "None")
    {
        sub_cycle = false;
        for (int i = 0; i <= max_level; i++)
        {
            n_cycle[i] = 1;
        }
    }
    else if (subcycling_mode == "Manual")
    {
        int cnt = pp.countval("subcycling_iterations");

        if (cnt == 1)
        {
            //
            // Set all values to the single available value.
            //
            int cycles = 0;

            pp.get("subcycling_iterations",cycles);

            n_cycle[0] = 1; // coarse level is always 1 cycle
            for (int i = 1; i <= max_level; i++)
            {
                n_cycle[i] = cycles;
            }
        }
        else if (cnt > 1)
        {
            //
            // Otherwise we expect a vector of max_grid_size values.
            //
            pp.getarr("subcycling_iterations",n_cycle,0,max_level+1);
            if (n_cycle[0] != 1)
            {
                amrex::Error("First entry of subcycling_iterations must be 1");
            }
        }
        else
        {
            amrex::Error("Must provide a valid subcycling_iterations if mode is Manual");
        }
        for (int i = 1; i <= max_level; i++)
        {
            if (n_cycle[i] > MaxRefRatio(i-1))
                amrex::Error("subcycling iterations must always be <= ref_ratio");
            if (n_cycle[i] <= 0)
                amrex::Error("subcycling iterations must always be > 0");
        }
    }
    else if (subcycling_mode == "Auto")
    {
        n_cycle[0] = 1;
        for (int i = 1; i <= max_level; i++)
        {
            n_cycle[i] = MaxRefRatio(i-1);
        }
    }
    else if (subcycling_mode == "Optimal")
    {
        // if subcycling mode is Optimal, n_cycle is set dynamically.
        // We'll initialize it to be Auto subcycling.
        n_cycle[0] = 1;
        for (int i = 1; i <= max_level; i++)
        {
            n_cycle[i] = MaxRefRatio(i-1);
        }
    }
    else
    {
        std::string err_message = "Unrecognzied subcycling mode: " + subcycling_mode + "\n";
        amrex::Error(err_message.c_str());
    }
}